

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O0

void __thiscall Future<void>::Private::ThreadPool::~ThreadPool(ThreadPool *this)

{
  bool bVar1;
  Iterator *pIVar2;
  ThreadContext *this_00;
  Job *data;
  Iterator local_48;
  Iterator end_1;
  Iterator i_1;
  Iterator end;
  Iterator i;
  Job job;
  ThreadPool *this_local;
  
  i.item = (Item *)0x0;
  pIVar2 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::begin(&this->_threads);
  end.item = pIVar2->item;
  pIVar2 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::end(&this->_threads);
  i_1.item = pIVar2->item;
  do {
    bVar1 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::Iterator::operator!=
                      (&end,&i_1);
    if (!bVar1) {
      pIVar2 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::begin(&this->_threads);
      end_1.item = pIVar2->item;
      pIVar2 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::end(&this->_threads);
      local_48.item = pIVar2->item;
      while (bVar1 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::Iterator::
                     operator!=(&end_1,&local_48), bVar1) {
        this_00 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::Iterator::operator->
                            (&end_1);
        Thread::join(&this_00->_thread);
        PoolList<Future<void>::Private::ThreadPool::ThreadContext>::Iterator::operator++(&end_1);
      }
      PoolList<Future<void>::Private::ThreadPool::ThreadContext>::~PoolList(&this->_threads);
      Mutex::~Mutex(&this->_mutex);
      FastSignal::~FastSignal(&this->_enqueuedSignal);
      FastSignal::~FastSignal(&this->_dequeuedSignal);
      LockFreeQueue<Future<void>::Private::ThreadPool::Job>::~LockFreeQueue(&this->_queue);
      return;
    }
    while (bVar1 = LockFreeQueue<Future<void>::Private::ThreadPool::Job>::push
                             (&this->_queue,(Job *)&i), ((bVar1 ^ 0xffU) & 1) != 0) {
      FastSignal::reset(&this->_dequeuedSignal);
      data = (Job *)&i;
      bVar1 = LockFreeQueue<Future<void>::Private::ThreadPool::Job>::push(&this->_queue,data);
      if (bVar1) break;
      FastSignal::wait(&this->_dequeuedSignal,data);
    }
    FastSignal::set(&this->_enqueuedSignal);
    PoolList<Future<void>::Private::ThreadPool::ThreadContext>::Iterator::operator++(&end);
  } while( true );
}

Assistant:

~ThreadPool()
    {
      Job job = {0, 0};
      for (PoolList<ThreadContext>::Iterator i = _threads.begin(), end = _threads.end(); i != end; ++i)
      {
        while (!_queue.push(job))
        {
          _dequeuedSignal.reset();
          if (_queue.push(job))
            break;
          _dequeuedSignal.wait();
        }
        _enqueuedSignal.set();
      }
      for (PoolList<ThreadContext>::Iterator i = _threads.begin(), end = _threads.end(); i != end; ++i)
        i->_thread.join();
    }